

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resolve.c
# Opt level: O0

void resolve_identity_backlink_update(lys_ident *der,lys_ident *base)

{
  ly_set *plVar1;
  int local_1c;
  int i;
  lys_ident *base_local;
  lys_ident *der_local;
  
  if ((der != (lys_ident *)0x0) && (base != (lys_ident *)0x0)) {
    if (base->der == (ly_set *)0x0) {
      plVar1 = ly_set_new();
      base->der = plVar1;
    }
    ly_set_add(base->der,der,1);
    for (local_1c = 0; local_1c < (int)(uint)base->base_size; local_1c = local_1c + 1) {
      resolve_identity_backlink_update(der,base->base[local_1c]);
    }
    return;
  }
  __assert_fail("der && base",
                "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/resolve.c"
                ,0x1464,
                "void resolve_identity_backlink_update(struct lys_ident *, struct lys_ident *)");
}

Assistant:

void
resolve_identity_backlink_update(struct lys_ident *der, struct lys_ident *base)
{
    int i;

    assert(der && base);

    if (!base->der) {
        /* create a set for backlinks if it does not exist */
        base->der = ly_set_new();
    }
    /* store backlink */
    ly_set_add(base->der, der, LY_SET_OPT_USEASLIST);

    /* do it recursively */
    for (i = 0; i < base->base_size; i++) {
        resolve_identity_backlink_update(der, base->base[i]);
    }
}